

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O3

int __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,convertable **d,hint *h)

{
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  hint *phVar7;
  content *d_1;
  int *piVar8;
  
  uVar1 = *this;
  if (((uVar1 != (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) &&
      (*(long *)((long)uVar1 + 8) == 0)) && (0xf < *(ulong *)((long)uVar1 + 0x18))) {
    uVar5 = *(ulong *)((long)uVar1 + 0x18) >> 4;
    phVar7 = (hint *)((long)uVar1 + 0x28);
    uVar6 = uVar5;
    do {
      if (((*(int *)(phVar7 + 4) != 0) && (*d == *(convertable **)(phVar7 + -8))) &&
         (cVar2 = mpt::graphic::hint::merge(phVar7,(int)h), cVar2 != '\0')) {
        *(int *)(phVar7 + 4) = *(int *)(phVar7 + 4) + 1;
        return 1;
      }
      phVar7 = phVar7 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    piVar8 = (int *)((long)uVar1 + 0x2c);
    do {
      if (*piVar8 == 0) {
        *(convertable **)(piVar8 + -3) = *d;
        piVar8[-1] = *(int *)h;
        *piVar8 = 1;
        return 0;
      }
      piVar8 = piVar8 + 4;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  puVar4 = (undefined8 *)mpt::array::append((ulong)this,(void *)0x10);
  if (puVar4 == (undefined8 *)0x0) {
    iVar3 = -4;
  }
  else {
    *puVar4 = *d;
    *(undefined4 *)(puVar4 + 1) = *(undefined4 *)h;
    *(undefined4 *)((long)puVar4 + 0xc) = 1;
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

int add(const T &d, const H &h = H())
	{
		element *cmp = static_cast<element *>(base());
		long max = length();
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				continue;
			}
			// different data elements
			if (d != cmp[i].data) {
				continue;
			}
			if (cmp[i].hint.merge(h)) {
				++cmp[i].used;
				return 1;
			}
		}
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				new (cmp + i) element(d, h);
				return 0;
			}
		}
		if (!(cmp = static_cast<element *>(array::append(sizeof(*cmp))))) {
			return BadOperation;
		}
		new (cmp) element(d, h);
		return 2;
	}